

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TabBarLayout(ImGuiTabBar *tab_bar)

{
  int *piVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  ImGuiTabItem *pIVar5;
  ImGuiWindow *pIVar6;
  bool bVar7;
  bool bVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  ImGuiTabItemFlags IVar14;
  ImGuiContext *pIVar15;
  ImGuiContext *pIVar16;
  bool bVar17;
  bool bVar18;
  int iVar19;
  ImGuiID IVar20;
  ImGuiTabItem *pIVar21;
  ImGuiTabItem *pIVar22;
  char *pcVar23;
  ImGuiShrinkWidthItem *__dest;
  long lVar24;
  char *__dest_00;
  uint uVar25;
  ImGuiShrinkWidthItem *pIVar26;
  int iVar27;
  undefined8 *puVar28;
  ulong uVar29;
  long lVar30;
  int iVar31;
  int iVar32;
  ulong uVar33;
  uint uVar34;
  long lVar35;
  float fVar36;
  ImVec2 IVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  ImVec2 size;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar43;
  float fVar44;
  ImGuiTabItem item_tmp;
  ImGuiID local_d4;
  ImGuiTabItem *local_d0;
  ImVec4 local_88;
  undefined8 local_70;
  ImVec4 local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  
  pIVar16 = GImGui;
  tab_bar->WantLayout = false;
  iVar27 = (tab_bar->Tabs).Size;
  if (iVar27 < 1) {
    iVar31 = 0;
  }
  else {
    lVar35 = 0;
    uVar29 = 0;
    uVar33 = 0;
    do {
      pIVar22 = (tab_bar->Tabs).Data;
      if (*(int *)((long)&pIVar22->LastFrameVisible + lVar35) < tab_bar->PrevFrameVisible) {
        if (*(ImGuiID *)((long)&pIVar22->ID + lVar35) == tab_bar->SelectedTabId) {
          tab_bar->SelectedTabId = 0;
        }
      }
      else {
        iVar31 = (int)uVar33;
        if (uVar29 != uVar33) {
          if ((long)iVar27 <= (long)uVar29) {
            LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                        ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
            pIVar22 = (tab_bar->Tabs).Data;
            iVar27 = (tab_bar->Tabs).Size;
          }
          pIVar21 = pIVar22;
          if (iVar27 <= iVar31) {
            LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                        ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
            pIVar21 = (tab_bar->Tabs).Data;
          }
          puVar28 = (undefined8 *)((long)&pIVar22->ID + lVar35);
          uVar3 = *puVar28;
          uVar9 = puVar28[1];
          fVar40 = *(float *)((long)puVar28 + 0x14);
          fVar38 = *(float *)(puVar28 + 3);
          fVar39 = *(float *)((long)puVar28 + 0x1c);
          piVar1 = &pIVar21[iVar31].NameOffset;
          *piVar1 = *(int *)(puVar28 + 2);
          piVar1[1] = (int)fVar40;
          piVar1[2] = (int)fVar38;
          piVar1[3] = (int)fVar39;
          pIVar21 = pIVar21 + iVar31;
          pIVar21->ID = (int)uVar3;
          pIVar21->Flags = (int)((ulong)uVar3 >> 0x20);
          pIVar21->LastFrameVisible = (int)uVar9;
          pIVar21->LastFrameSelected = (int)((ulong)uVar9 >> 0x20);
          iVar27 = (tab_bar->Tabs).Size;
        }
        uVar33 = (ulong)(iVar31 + 1);
      }
      iVar31 = (int)uVar33;
      uVar29 = uVar29 + 1;
      lVar35 = lVar35 + 0x20;
    } while ((long)uVar29 < (long)iVar27);
  }
  if (iVar27 != iVar31) {
    iVar27 = (tab_bar->Tabs).Capacity;
    if (iVar27 < iVar31) {
      if (iVar27 == 0) {
        iVar27 = 8;
      }
      else {
        iVar27 = iVar27 / 2 + iVar27;
      }
      if (iVar27 <= iVar31) {
        iVar27 = iVar31;
      }
      pIVar21 = (ImGuiTabItem *)MemAlloc((long)iVar27 << 5);
      pIVar22 = (tab_bar->Tabs).Data;
      if (pIVar22 != (ImGuiTabItem *)0x0) {
        memcpy(pIVar21,pIVar22,(long)(tab_bar->Tabs).Size << 5);
        MemFree((tab_bar->Tabs).Data);
      }
      (tab_bar->Tabs).Data = pIVar21;
      (tab_bar->Tabs).Capacity = iVar27;
    }
    (tab_bar->Tabs).Size = iVar31;
  }
  local_d4 = tab_bar->NextSelectedTabId;
  if (local_d4 != 0) {
    tab_bar->SelectedTabId = local_d4;
    tab_bar->NextSelectedTabId = 0;
  }
  if (tab_bar->ReorderRequestTabId != 0) {
    pIVar22 = TabBarFindTabByID(tab_bar,tab_bar->ReorderRequestTabId);
    if (pIVar22 != (ImGuiTabItem *)0x0) {
      iVar27 = ImGuiTabBar::GetTabOrder(tab_bar,pIVar22);
      uVar25 = tab_bar->ReorderRequestDir + iVar27;
      if ((-1 < (int)uVar25) && ((int)uVar25 < (tab_bar->Tabs).Size)) {
        pIVar5 = (tab_bar->Tabs).Data;
        local_68.x = (float)pIVar22->ID;
        local_68.y = (float)pIVar22->Flags;
        local_68.z = (float)pIVar22->LastFrameVisible;
        local_68.w = (float)pIVar22->LastFrameSelected;
        local_58._0_4_ = pIVar22->NameOffset;
        local_58._4_4_ = pIVar22->Offset;
        uStack_50._0_4_ = pIVar22->Width;
        uStack_50._4_4_ = pIVar22->ContentWidth;
        pIVar21 = pIVar5 + uVar25;
        IVar20 = pIVar21->ID;
        IVar14 = pIVar21->Flags;
        iVar27 = pIVar21->LastFrameVisible;
        iVar31 = pIVar21->LastFrameSelected;
        pIVar21 = pIVar5 + uVar25;
        fVar40 = pIVar21->Offset;
        uVar3 = *(undefined8 *)(&pIVar21->NameOffset + 2);
        pIVar22->NameOffset = pIVar21->NameOffset;
        pIVar22->Offset = fVar40;
        *(undefined8 *)&pIVar22->Width = uVar3;
        pIVar22->ID = IVar20;
        pIVar22->Flags = IVar14;
        pIVar22->LastFrameVisible = iVar27;
        pIVar22->LastFrameSelected = iVar31;
        pIVar22 = pIVar5 + uVar25;
        pIVar22->ID = (ImGuiID)local_68.x;
        pIVar22->Flags = (ImGuiTabItemFlags)local_68.y;
        pIVar22->LastFrameVisible = (int)local_68.z;
        pIVar22->LastFrameSelected = (int)local_68.w;
        pIVar22 = pIVar5 + uVar25;
        pIVar22->NameOffset = (undefined4)local_58;
        pIVar22->Offset = (float)local_58._4_4_;
        *(undefined8 *)(&pIVar22->NameOffset + 2) = uStack_50;
        if (pIVar5[uVar25].ID == tab_bar->SelectedTabId) {
          local_d4 = pIVar5[uVar25].ID;
        }
      }
      if ((tab_bar->Flags & 0x400000) != 0) {
        MarkIniSettingsDirty();
      }
    }
    tab_bar->ReorderRequestTabId = 0;
  }
  pIVar15 = GImGui;
  if ((tab_bar->Flags & 4) != 0) {
    pIVar6 = GImGui->CurrentWindow;
    fVar40 = (GImGui->Style).FramePadding.y;
    fVar38 = GImGui->FontSize;
    IVar37 = (pIVar6->DC).CursorPos;
    fVar39 = (tab_bar->BarRect).Min.y;
    (pIVar6->DC).CursorPos.x = (tab_bar->BarRect).Min.x - fVar40;
    (pIVar6->DC).CursorPos.y = fVar39;
    (tab_bar->BarRect).Min.x = fVar38 + fVar40 + (tab_bar->BarRect).Min.x;
    local_68.x = (pIVar15->Style).Colors[0].x;
    local_68.y = (pIVar15->Style).Colors[0].y;
    uVar10 = (pIVar15->Style).Colors[0].z;
    uVar11 = (pIVar15->Style).Colors[0].w;
    local_68.w = (float)uVar11 * 0.5;
    local_68.z = (float)uVar10;
    PushStyleColor(0,&local_68);
    local_88.x = 0.0;
    local_88.y = 0.0;
    local_88.z = 0.0;
    local_88.w = 0.0;
    PushStyleColor(0x15,&local_88);
    bVar17 = BeginCombo("##v",(char *)0x0,0x40);
    PopStyleColor(2);
    if (bVar17) {
      if (0 < (tab_bar->Tabs).Size) {
        lVar30 = 0;
        lVar35 = 0;
        pIVar22 = (ImGuiTabItem *)0x0;
        do {
          pIVar5 = (tab_bar->Tabs).Data;
          pIVar21 = (ImGuiTabItem *)((long)&pIVar5->ID + lVar30);
          pcVar23 = ImGuiTabBar::GetTabName(tab_bar,pIVar21);
          local_88.x = 0.0;
          local_88.y = 0.0;
          bVar17 = Selectable(pcVar23,tab_bar->SelectedTabId ==
                                      *(ImGuiID *)((long)&pIVar5->ID + lVar30),0,(ImVec2 *)&local_88
                             );
          if (bVar17) {
            pIVar22 = pIVar21;
          }
          lVar35 = lVar35 + 1;
          lVar30 = lVar30 + 0x20;
        } while (lVar35 < (tab_bar->Tabs).Size);
        EndPopup();
        (pIVar6->DC).CursorPos = IVar37;
        if (pIVar22 != (ImGuiTabItem *)0x0) {
          local_d4 = pIVar22->ID;
          tab_bar->SelectedTabId = local_d4;
        }
        goto LAB_001e8981;
      }
      EndPopup();
    }
    (pIVar6->DC).CursorPos = IVar37;
  }
LAB_001e8981:
  uVar25 = (tab_bar->Tabs).Size;
  iVar27 = (pIVar16->ShrinkWidthBuffer).Capacity;
  uVar34 = uVar25;
  if (iVar27 < (int)uVar25) {
    if (iVar27 == 0) {
      uVar34 = 8;
    }
    else {
      uVar34 = iVar27 / 2 + iVar27;
    }
    if ((int)uVar34 <= (int)uVar25) {
      uVar34 = uVar25;
    }
    __dest = (ImGuiShrinkWidthItem *)MemAlloc((long)(int)uVar34 << 3);
    pIVar26 = (pIVar16->ShrinkWidthBuffer).Data;
    if (pIVar26 != (ImGuiShrinkWidthItem *)0x0) {
      memcpy(__dest,pIVar26,(long)(pIVar16->ShrinkWidthBuffer).Size << 3);
      MemFree((pIVar16->ShrinkWidthBuffer).Data);
    }
    (pIVar16->ShrinkWidthBuffer).Data = __dest;
    (pIVar16->ShrinkWidthBuffer).Capacity = uVar34;
    uVar34 = (tab_bar->Tabs).Size;
  }
  uVar29 = (ulong)uVar34;
  (pIVar16->ShrinkWidthBuffer).Size = uVar25;
  if ((int)uVar34 < 1) {
    bVar17 = true;
    local_d0 = (ImGuiTabItem *)0x0;
    fVar40 = 0.0;
  }
  else {
    fVar40 = 0.0;
    bVar17 = false;
    lVar35 = 0;
    lVar30 = 0;
    local_d0 = (ImGuiTabItem *)0x0;
    do {
      pIVar22 = (tab_bar->Tabs).Data;
      if (*(int *)((long)&pIVar22->LastFrameVisible + lVar35) < tab_bar->PrevFrameVisible) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                    ,0x1a7d,"TabBarLayout","ImGui ASSERT FAILED: %s",
                    "tab->LastFrameVisible >= tab_bar->PrevFrameVisible");
      }
      pIVar21 = (ImGuiTabItem *)((long)&pIVar22->ID + lVar35);
      if ((local_d0 == (ImGuiTabItem *)0x0) ||
         (local_d0->LastFrameSelected < *(int *)((long)&pIVar22->LastFrameSelected + lVar35))) {
        local_d0 = pIVar21;
      }
      if (*(ImGuiID *)((long)&pIVar22->ID + lVar35) == tab_bar->SelectedTabId) {
        bVar17 = true;
      }
      pcVar23 = ImGuiTabBar::GetTabName(tab_bar,pIVar21);
      IVar37 = TabItemCalcSize(pcVar23,(*(uint *)((long)&pIVar22->Flags + lVar35) >> 0x14 & 1) == 0)
      ;
      fVar38 = IVar37.x;
      *(float *)((long)&pIVar22->ContentWidth + lVar35) = fVar38;
      if (lVar30 == 0) {
        fVar39 = 0.0;
      }
      else {
        fVar39 = (pIVar16->Style).ItemInnerSpacing.x;
      }
      lVar24 = (long)(pIVar16->ShrinkWidthBuffer).Size;
      fVar36 = fVar38;
      if (lVar24 <= lVar30) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
        fVar36 = *(float *)((long)&pIVar22->ContentWidth + lVar35);
        lVar24 = (long)(pIVar16->ShrinkWidthBuffer).Size;
      }
      pIVar26 = (pIVar16->ShrinkWidthBuffer).Data;
      pIVar26[lVar30].Index = (int)lVar30;
      if (lVar24 <= lVar30) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
        pIVar26 = (pIVar16->ShrinkWidthBuffer).Data;
      }
      fVar40 = fVar40 + fVar38 + fVar39;
      pIVar26[lVar30].Width = fVar36;
      lVar30 = lVar30 + 1;
      uVar29 = (ulong)(tab_bar->Tabs).Size;
      lVar35 = lVar35 + 0x20;
    } while (lVar30 < (long)uVar29);
    bVar17 = !bVar17;
  }
  iVar27 = (int)uVar29;
  fVar38 = (tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x;
  fVar38 = (float)(-(uint)(0.0 <= fVar38) & (uint)fVar38);
  fVar40 = (float)(-(uint)(fVar38 < fVar40) & (uint)(fVar40 - fVar38));
  if ((fVar40 <= 0.0) || ((tab_bar->Flags & 0x40) == 0)) {
    if (iVar27 < 1) goto LAB_001e8e3d;
    fVar40 = GImGui->FontSize * 20.0;
    lVar30 = 0x1c;
    lVar35 = 0;
    do {
      pIVar22 = (tab_bar->Tabs).Data;
      fVar38 = *(float *)((long)&pIVar22->ID + lVar30);
      if (fVar40 <= fVar38) {
        fVar38 = fVar40;
      }
      *(float *)((long)pIVar22 + lVar30 + -4) = fVar38;
      if (fVar38 <= 0.0) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                    ,0x1aa4,"TabBarLayout","ImGui ASSERT FAILED: %s","tab->Width > 0.0f");
        uVar29 = (ulong)(uint)(tab_bar->Tabs).Size;
      }
      lVar35 = lVar35 + 1;
      lVar30 = lVar30 + 0x20;
    } while (lVar35 < (int)uVar29);
LAB_001e8dcf:
    tab_bar->OffsetNextTab = 0.0;
    iVar27 = (int)uVar29;
    if (iVar27 < 1) goto LAB_001e8e53;
    pIVar22 = (tab_bar->Tabs).Data;
    fVar40 = (pIVar16->Style).ItemInnerSpacing.x;
    fVar38 = 0.0;
    fVar39 = 0.0;
    lVar35 = 0;
    do {
      *(float *)((long)&pIVar22->Offset + lVar35) = fVar38;
      if ((local_d4 == 0) &&
         (local_d4 = *(ImGuiID *)((long)&pIVar22->ID + lVar35),
         pIVar16->NavJustMovedToId != local_d4)) {
        local_d4 = 0;
      }
      uVar3 = *(undefined8 *)((long)&pIVar22->Width + lVar35);
      fVar38 = fVar38 + (float)uVar3 + fVar40;
      fVar39 = fVar39 + (float)((ulong)uVar3 >> 0x20) + fVar40;
      lVar35 = lVar35 + 0x20;
    } while ((uVar29 & 0xffffffff) << 5 != lVar35);
  }
  else {
    ShrinkWidths((pIVar16->ShrinkWidthBuffer).Data,(pIVar16->ShrinkWidthBuffer).Size,fVar40);
    iVar27 = (tab_bar->Tabs).Size;
    if (0 < iVar27) {
      lVar35 = 0;
      do {
        lVar30 = (long)(pIVar16->ShrinkWidthBuffer).Size;
        if (lVar30 <= lVar35) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
          lVar30 = (long)(pIVar16->ShrinkWidthBuffer).Size;
        }
        pIVar26 = (pIVar16->ShrinkWidthBuffer).Data;
        fVar40 = pIVar26[lVar35].Width;
        if (lVar30 <= lVar35) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
          pIVar26 = (pIVar16->ShrinkWidthBuffer).Data;
        }
        iVar27 = pIVar26[lVar35].Index;
        uVar25 = (tab_bar->Tabs).Size;
        if ((int)uVar25 <= iVar27) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
          uVar25 = (tab_bar->Tabs).Size;
        }
        uVar29 = (ulong)uVar25;
        (tab_bar->Tabs).Data[iVar27].Width = (float)(int)fVar40;
        lVar35 = lVar35 + 1;
      } while (lVar35 < (int)uVar25);
      goto LAB_001e8dcf;
    }
LAB_001e8e3d:
    tab_bar->OffsetNextTab = 0.0;
LAB_001e8e53:
    fVar40 = (pIVar16->Style).ItemInnerSpacing.x;
    fVar38 = 0.0;
    fVar39 = 0.0;
  }
  fVar38 = (float)(-(uint)(0.0 <= fVar38 - fVar40) & (uint)(fVar38 - fVar40));
  tab_bar->OffsetMax = fVar38;
  pIVar15 = GImGui;
  tab_bar->OffsetMaxIdeal = (float)(-(uint)(0.0 <= fVar39 - fVar40) & (uint)(fVar39 - fVar40));
  if (1 < iVar27) {
    fVar40 = (tab_bar->BarRect).Min.x;
    fVar39 = (tab_bar->BarRect).Max.x;
    if ((fVar39 - fVar40 < fVar38) && ((tab_bar->Flags & 0x90U) == 0x80)) {
      pIVar6 = GImGui->CurrentWindow;
      fVar44 = GImGui->FontSize + -2.0;
      fVar38 = (GImGui->Style).FramePadding.y;
      size.y = fVar38 + fVar38 + GImGui->FontSize;
      size.x = fVar44;
      local_48 = ZEXT416((uint)fVar44);
      fVar44 = fVar44 + fVar44;
      IVar37 = (pIVar6->DC).CursorPos;
      fVar38 = (tab_bar->BarRect).Max.y;
      fVar36 = IVar37.x;
      fVar43 = IVar37.y;
      bVar8 = fVar43 < (tab_bar->BarRect).Min.y;
      bVar7 = fVar39 < fVar44 + fVar36;
      if ((fVar38 < fVar43 || (fVar36 < fVar40 || bVar8)) || bVar7) {
        local_68.y = fVar38 + 0.0;
        local_68.x = (GImGui->Style).ItemInnerSpacing.x + fVar39;
        PushClipRect(&(tab_bar->BarRect).Min,(ImVec2 *)&local_68,true);
      }
      local_68.x = (pIVar15->Style).Colors[0].x;
      local_68.y = (pIVar15->Style).Colors[0].y;
      uVar12 = (pIVar15->Style).Colors[0].z;
      uVar13 = (pIVar15->Style).Colors[0].w;
      local_68.w = (float)uVar13 * 0.5;
      local_68.z = (float)uVar12;
      PushStyleColor(0,&local_68);
      local_88.x = 0.0;
      local_88.y = 0.0;
      local_88.z = 0.0;
      local_88.w = 0.0;
      PushStyleColor(0x15,&local_88);
      local_70._0_4_ = (pIVar15->IO).KeyRepeatDelay;
      local_70._4_4_ = (pIVar15->IO).KeyRepeatRate;
      (pIVar15->IO).KeyRepeatDelay = 0.25;
      (pIVar15->IO).KeyRepeatRate = 0.2;
      fVar39 = (tab_bar->BarRect).Min.y;
      (pIVar6->DC).CursorPos.x = (tab_bar->BarRect).Max.x - fVar44;
      (pIVar6->DC).CursorPos.y = fVar39;
      bVar18 = ArrowButtonEx("##<",0,size,3);
      iVar27 = -(uint)bVar18;
      fVar39 = (tab_bar->BarRect).Min.y;
      (pIVar6->DC).CursorPos.x = (float)local_48._0_4_ + ((tab_bar->BarRect).Max.x - fVar44);
      (pIVar6->DC).CursorPos.y = fVar39;
      bVar18 = ArrowButtonEx("##>",1,size,3);
      if (bVar18) {
        iVar27 = 1;
      }
      PopStyleColor(2);
      (pIVar15->IO).KeyRepeatDelay = (float)(undefined4)local_70;
      (pIVar15->IO).KeyRepeatRate = (float)local_70._4_4_;
      if ((fVar38 < fVar43 || (fVar36 < fVar40 || bVar8)) || bVar7) {
        PopClipRect();
      }
      if ((iVar27 == 0) ||
         (pIVar22 = TabBarFindTabByID(tab_bar,tab_bar->SelectedTabId),
         pIVar22 == (ImGuiTabItem *)0x0)) {
        (pIVar6->DC).CursorPos = IVar37;
        (tab_bar->BarRect).Max.x = (tab_bar->BarRect).Max.x - (fVar44 + 1.0);
      }
      else {
        iVar19 = ImGuiTabBar::GetTabOrder(tab_bar,pIVar22);
        iVar27 = iVar27 + iVar19;
        iVar31 = (tab_bar->Tabs).Size;
        iVar32 = iVar19;
        if (iVar27 < iVar31) {
          iVar32 = iVar27;
        }
        if (iVar27 < 0) {
          iVar32 = iVar19;
        }
        if (iVar31 <= iVar32) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
        }
        pIVar22 = (tab_bar->Tabs).Data;
        (pIVar6->DC).CursorPos = IVar37;
        (tab_bar->BarRect).Max.x = (tab_bar->BarRect).Max.x - (fVar44 + 1.0);
        if (pIVar22 != (ImGuiTabItem *)0x0) {
          local_d4 = pIVar22[iVar32].ID;
          tab_bar->SelectedTabId = local_d4;
        }
      }
    }
  }
  if (bVar17) {
    tab_bar->SelectedTabId = 0;
LAB_001e9194:
    IVar20 = 0;
    if ((tab_bar->NextSelectedTabId == 0) && (IVar20 = 0, local_d0 != (ImGuiTabItem *)0x0)) {
      local_d4 = local_d0->ID;
      tab_bar->SelectedTabId = local_d4;
      IVar20 = local_d4;
    }
  }
  else {
    IVar20 = tab_bar->SelectedTabId;
    if (IVar20 == 0) goto LAB_001e9194;
  }
  tab_bar->VisibleTabId = IVar20;
  tab_bar->VisibleTabWasSubmitted = false;
  if ((local_d4 != 0) &&
     (pIVar22 = TabBarFindTabByID(tab_bar,local_d4), pIVar22 != (ImGuiTabItem *)0x0)) {
    fVar40 = GImGui->FontSize;
    iVar27 = ImGuiTabBar::GetTabOrder(tab_bar,pIVar22);
    fVar38 = fVar40;
    if (iVar27 < 1) {
      fVar38 = -0.0;
    }
    fVar38 = pIVar22->Offset - fVar38;
    if ((tab_bar->Tabs).Size <= iVar27 + 1) {
      fVar40 = 1.0;
    }
    fVar40 = pIVar22->Offset + pIVar22->Width + fVar40;
    tab_bar->ScrollingTargetDistToVisibility = 0.0;
    if ((fVar38 < tab_bar->ScrollingTarget) ||
       (fVar39 = (tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x, fVar39 <= fVar40 - fVar38)) {
      fVar36 = tab_bar->ScrollingAnim - fVar40;
    }
    else {
      if (fVar40 - fVar39 <= tab_bar->ScrollingTarget) goto LAB_001e9287;
      fVar36 = (fVar38 - fVar39) - tab_bar->ScrollingAnim;
      fVar38 = fVar40 - fVar39;
    }
    tab_bar->ScrollingTargetDistToVisibility = (float)(-(uint)(0.0 <= fVar36) & (uint)fVar36);
    tab_bar->ScrollingTarget = fVar38;
  }
LAB_001e9287:
  fVar40 = tab_bar->OffsetMax - ((tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x);
  uVar2 = tab_bar->ScrollingAnim;
  uVar4 = tab_bar->ScrollingTarget;
  auVar41._4_4_ = uVar4;
  auVar41._0_4_ = uVar2;
  auVar41._8_8_ = 0;
  auVar42._4_4_ = fVar40;
  auVar42._0_4_ = fVar40;
  auVar42._8_4_ = fVar40;
  auVar42._12_4_ = fVar40;
  auVar42 = minps(auVar41,auVar42);
  fVar40 = (float)(-(uint)(0.0 <= auVar42._0_4_) & (uint)auVar42._0_4_);
  fVar38 = (float)(-(uint)(0.0 <= auVar42._4_4_) & (uint)auVar42._4_4_);
  tab_bar->ScrollingAnim = fVar40;
  tab_bar->ScrollingTarget = fVar38;
  if ((fVar40 != fVar38) || (NAN(fVar40) || NAN(fVar38))) {
    fVar39 = pIVar16->FontSize;
    fVar36 = fVar39 * 70.0;
    uVar25 = -(uint)(fVar36 <= tab_bar->ScrollingSpeed);
    fVar43 = ABS(fVar38 - fVar40) / 0.3;
    fVar36 = (float)(~uVar25 & (uint)fVar36 | (uint)tab_bar->ScrollingSpeed & uVar25);
    uVar25 = -(uint)(fVar43 <= fVar36);
    fVar43 = (float)(~uVar25 & (uint)fVar43 | uVar25 & (uint)fVar36);
    tab_bar->ScrollingSpeed = fVar43;
    fVar36 = fVar38;
    if ((pIVar16->FrameCount <= tab_bar->PrevFrameVisible + 1) &&
       (tab_bar->ScrollingTargetDistToVisibility <= fVar39 * 10.0)) {
      fVar43 = fVar43 * (pIVar16->IO).DeltaTime;
      if (fVar38 <= fVar40) {
        fVar36 = fVar40;
        if (fVar38 < fVar40) {
          fVar40 = fVar40 - fVar43;
          uVar25 = -(uint)(fVar38 <= fVar40);
          fVar36 = (float)((uint)fVar40 & uVar25 | ~uVar25 & (uint)fVar38);
        }
      }
      else {
        fVar36 = fVar40 + fVar43;
        if (fVar38 <= fVar36) {
          fVar36 = fVar38;
        }
      }
    }
    tab_bar->ScrollingAnim = fVar36;
  }
  else {
    tab_bar->ScrollingSpeed = 0.0;
  }
  if ((tab_bar->Flags & 0x100000) == 0) {
    if ((tab_bar->TabsNames).Buf.Capacity < 0) {
      __dest_00 = (char *)MemAlloc(0);
      pcVar23 = (tab_bar->TabsNames).Buf.Data;
      if (pcVar23 != (char *)0x0) {
        memcpy(__dest_00,pcVar23,(long)(tab_bar->TabsNames).Buf.Size);
        MemFree((tab_bar->TabsNames).Buf.Data);
      }
      (tab_bar->TabsNames).Buf.Data = __dest_00;
      (tab_bar->TabsNames).Buf.Capacity = 0;
    }
    (tab_bar->TabsNames).Buf.Size = 0;
  }
  return;
}

Assistant:

static void ImGui::TabBarLayout(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    tab_bar->WantLayout = false;

    // Garbage collect
    int tab_dst_n = 0;
    for (int tab_src_n = 0; tab_src_n < tab_bar->Tabs.Size; tab_src_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_src_n];
        if (tab->LastFrameVisible < tab_bar->PrevFrameVisible)
        {
            if (tab->ID == tab_bar->SelectedTabId)
                tab_bar->SelectedTabId = 0;
            continue;
        }
        if (tab_dst_n != tab_src_n)
            tab_bar->Tabs[tab_dst_n] = tab_bar->Tabs[tab_src_n];
        tab_dst_n++;
    }
    if (tab_bar->Tabs.Size != tab_dst_n)
        tab_bar->Tabs.resize(tab_dst_n);

    // Setup next selected tab
    ImGuiID scroll_track_selected_tab_id = 0;
    if (tab_bar->NextSelectedTabId)
    {
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
        tab_bar->NextSelectedTabId = 0;
        scroll_track_selected_tab_id = tab_bar->SelectedTabId;
    }

    // Process order change request (we could probably process it when requested but it's just saner to do it in a single spot).
    if (tab_bar->ReorderRequestTabId != 0)
    {
        if (ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId))
        {
            //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
            int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestDir;
            if (tab2_order >= 0 && tab2_order < tab_bar->Tabs.Size)
            {
                ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
                ImGuiTabItem item_tmp = *tab1;
                *tab1 = *tab2;
                *tab2 = item_tmp;
                if (tab2->ID == tab_bar->SelectedTabId)
                    scroll_track_selected_tab_id = tab2->ID;
                tab1 = tab2 = NULL;
            }
            if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
                MarkIniSettingsDirty();
        }
        tab_bar->ReorderRequestTabId = 0;
    }

    // Tab List Popup (will alter tab_bar->BarRect and therefore the available width!)
    const bool tab_list_popup_button = (tab_bar->Flags & ImGuiTabBarFlags_TabListPopupButton) != 0;
    if (tab_list_popup_button)
        if (ImGuiTabItem* tab_to_select = TabBarTabListPopupButton(tab_bar)) // NB: Will alter BarRect.Max.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // Compute ideal widths
    g.ShrinkWidthBuffer.resize(tab_bar->Tabs.Size);
    float width_total_contents = 0.0f;
    ImGuiTabItem* most_recently_selected_tab = NULL;
    bool found_selected_tab_id = false;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        IM_ASSERT(tab->LastFrameVisible >= tab_bar->PrevFrameVisible);

        if (most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected)
            most_recently_selected_tab = tab;
        if (tab->ID == tab_bar->SelectedTabId)
            found_selected_tab_id = true;

        // Refresh tab width immediately, otherwise changes of style e.g. style.FramePadding.x would noticeably lag in the tab bar.
        // Additionally, when using TabBarAddTab() to manipulate tab bar order we occasionally insert new tabs that don't have a width yet,
        // and we cannot wait for the next BeginTabItem() call. We cannot compute this width within TabBarAddTab() because font size depends on the active window.
        const char* tab_name = tab_bar->GetTabName(tab);
        const bool has_close_button = (tab->Flags & ImGuiTabItemFlags_NoCloseButton) ? false : true;
        tab->ContentWidth = TabItemCalcSize(tab_name, has_close_button).x;

        width_total_contents += (tab_n > 0 ? g.Style.ItemInnerSpacing.x : 0.0f) + tab->ContentWidth;

        // Store data so we can build an array sorted by width if we need to shrink tabs down
        g.ShrinkWidthBuffer[tab_n].Index = tab_n;
        g.ShrinkWidthBuffer[tab_n].Width = tab->ContentWidth;
    }

    // Compute width
    const float initial_offset_x = 0.0f; // g.Style.ItemInnerSpacing.x;
    const float width_avail = ImMax(tab_bar->BarRect.GetWidth() - initial_offset_x, 0.0f);
    float width_excess = (width_avail < width_total_contents) ? (width_total_contents - width_avail) : 0.0f;
    if (width_excess > 0.0f && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyResizeDown))
    {
        // If we don't have enough room, resize down the largest tabs first
        ShrinkWidths(g.ShrinkWidthBuffer.Data, g.ShrinkWidthBuffer.Size, width_excess);
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
            tab_bar->Tabs[g.ShrinkWidthBuffer[tab_n].Index].Width = IM_FLOOR(g.ShrinkWidthBuffer[tab_n].Width);
    }
    else
    {
        const float tab_max_width = TabBarCalcMaxTabWidth();
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
            tab->Width = ImMin(tab->ContentWidth, tab_max_width);
            IM_ASSERT(tab->Width > 0.0f);
        }
    }

    // Layout all active tabs
    float offset_x = initial_offset_x;
    float offset_x_ideal = offset_x;
    tab_bar->OffsetNextTab = offset_x; // This is used by non-reorderable tab bar where the submission order is always honored.
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        tab->Offset = offset_x;
        if (scroll_track_selected_tab_id == 0 && g.NavJustMovedToId == tab->ID)
            scroll_track_selected_tab_id = tab->ID;
        offset_x += tab->Width + g.Style.ItemInnerSpacing.x;
        offset_x_ideal += tab->ContentWidth + g.Style.ItemInnerSpacing.x;
    }
    tab_bar->OffsetMax = ImMax(offset_x - g.Style.ItemInnerSpacing.x, 0.0f);
    tab_bar->OffsetMaxIdeal = ImMax(offset_x_ideal - g.Style.ItemInnerSpacing.x, 0.0f);

    // Horizontal scrolling buttons
    const bool scrolling_buttons = (tab_bar->OffsetMax > tab_bar->BarRect.GetWidth() && tab_bar->Tabs.Size > 1) && !(tab_bar->Flags & ImGuiTabBarFlags_NoTabListScrollingButtons) && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyScroll);
    if (scrolling_buttons)
        if (ImGuiTabItem* tab_to_select = TabBarScrollingButtons(tab_bar)) // NB: Will alter BarRect.Max.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // If we have lost the selected tab, select the next most recently active one
    if (found_selected_tab_id == false)
        tab_bar->SelectedTabId = 0;
    if (tab_bar->SelectedTabId == 0 && tab_bar->NextSelectedTabId == 0 && most_recently_selected_tab != NULL)
        scroll_track_selected_tab_id = tab_bar->SelectedTabId = most_recently_selected_tab->ID;

    // Lock in visible tab
    tab_bar->VisibleTabId = tab_bar->SelectedTabId;
    tab_bar->VisibleTabWasSubmitted = false;

    // Update scrolling
    if (scroll_track_selected_tab_id)
        if (ImGuiTabItem* scroll_track_selected_tab = TabBarFindTabByID(tab_bar, scroll_track_selected_tab_id))
            TabBarScrollToTab(tab_bar, scroll_track_selected_tab);
    tab_bar->ScrollingAnim = TabBarScrollClamp(tab_bar, tab_bar->ScrollingAnim);
    tab_bar->ScrollingTarget = TabBarScrollClamp(tab_bar, tab_bar->ScrollingTarget);
    if (tab_bar->ScrollingAnim != tab_bar->ScrollingTarget)
    {
        // Scrolling speed adjust itself so we can always reach our target in 1/3 seconds.
        // Teleport if we are aiming far off the visible line
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, 70.0f * g.FontSize);
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, ImFabs(tab_bar->ScrollingTarget - tab_bar->ScrollingAnim) / 0.3f);
        const bool teleport = (tab_bar->PrevFrameVisible + 1 < g.FrameCount) || (tab_bar->ScrollingTargetDistToVisibility > 10.0f * g.FontSize);
        tab_bar->ScrollingAnim = teleport ? tab_bar->ScrollingTarget : ImLinearSweep(tab_bar->ScrollingAnim, tab_bar->ScrollingTarget, g.IO.DeltaTime * tab_bar->ScrollingSpeed);
    }
    else
    {
        tab_bar->ScrollingSpeed = 0.0f;
    }

    // Clear name buffers
    if ((tab_bar->Flags & ImGuiTabBarFlags_DockNode) == 0)
        tab_bar->TabsNames.Buf.resize(0);
}